

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

void trigger_user_callback(pa_stream *s,void *input_data,size_t nbytes,cubeb_stream_conflict *stm)

{
  float fVar1;
  pa_context *ppVar2;
  _func_pa_time_event_ptr_pa_context_ptr_pa_usec_t_pa_time_event_cb_t_void_ptr *p_Var3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  pa_usec_t pVar9;
  pa_time_event *ppVar10;
  ulong uVar11;
  long lVar12;
  size_t size;
  void *buffer;
  pa_usec_t latency;
  ulong local_58;
  pa_stream *local_50;
  void *local_48;
  pa_usec_t local_40;
  pa_sample_spec *local_38;
  
  local_50 = s;
  sVar5 = (*cubeb_pa_frame_size)(&stm->output_sample_spec);
  if (nbytes % sVar5 != 0) {
    __assert_fail("nbytes % frame_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                  ,0x106,
                  "void trigger_user_callback(pa_stream *, const void *, size_t, cubeb_stream *)");
  }
  local_38 = &stm->input_sample_spec;
  lVar12 = 0;
  while( true ) {
    if (nbytes == 0) {
      return;
    }
    local_58 = nbytes;
    iVar4 = (*cubeb_pa_stream_begin_write)(local_50,&local_48,&local_58);
    if (iVar4 != 0) {
      __assert_fail("r == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x10f,
                    "void trigger_user_callback(pa_stream *, const void *, size_t, cubeb_stream *)")
      ;
    }
    if (local_58 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x110,
                    "void trigger_user_callback(pa_stream *, const void *, size_t, cubeb_stream *)")
      ;
    }
    if (local_58 % sVar5 != 0) {
      __assert_fail("size % frame_size == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x111,
                    "void trigger_user_callback(pa_stream *, const void *, size_t, cubeb_stream *)")
      ;
    }
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (CUBEB_LOG_NORMAL < g_cubeb_log_level))
    {
      (*g_cubeb_log_callback)
                ("%s:%d: Trigger user callback with output buffer size=%zd, read_offset=%zd\n",
                 "cubeb_pulse.c",0x114,local_58,lVar12);
    }
    uVar6 = (*stm->data_callback)
                      (stm,stm->user_ptr,(void *)((long)input_data + lVar12),local_48,
                       local_58 / sVar5);
    if ((long)uVar6 < 0) break;
    if (input_data != (void *)0x0) {
      sVar7 = (*cubeb_pa_frame_size)(local_38);
      lVar12 = lVar12 + (local_58 / sVar5) * sVar7;
    }
    fVar1 = stm->volume;
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      uVar8 = ((stm->output_sample_spec).channels * local_58) / sVar5 & 0xffffffff;
      if ((uint)((stm->output_sample_spec).format + ~PA_SAMPLE_ULAW) < 2) {
        for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
          *(short *)((long)local_48 + uVar11 * 2) =
               (short)(int)((float)(int)*(short *)((long)local_48 + uVar11 * 2) * fVar1);
        }
      }
      else {
        for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
          *(float *)((long)local_48 + uVar11 * 4) =
               stm->volume * *(float *)((long)local_48 + uVar11 * 4);
        }
      }
    }
    iVar4 = (*cubeb_pa_stream_write)
                      (local_50,local_48,uVar6 * sVar5,(pa_free_cb_t)0x0,0,PA_SEEK_RELATIVE);
    if (iVar4 != 0) {
      __assert_fail("r == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x136,
                    "void trigger_user_callback(pa_stream *, const void *, size_t, cubeb_stream *)")
      ;
    }
    nbytes = nbytes - local_58;
    if (uVar6 < local_58 / sVar5) {
      local_40 = 0;
      iVar4 = (*cubeb_pa_stream_get_latency)(local_50,&local_40,(int *)0x0);
      p_Var3 = cubeb_pa_context_rttime_new;
      if (iVar4 != 0) {
        if (iVar4 != -0x10) {
          __assert_fail("r == 0 || r == -PA_ERR_NODATA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                        ,0x13f,
                        "void trigger_user_callback(pa_stream *, const void *, size_t, cubeb_stream *)"
                       );
        }
        local_40 = 100000;
      }
      if (stm->drain_timer != (pa_time_event *)0x0) {
        __assert_fail("!stm->drain_timer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                      ,0x142,
                      "void trigger_user_callback(pa_stream *, const void *, size_t, cubeb_stream *)"
                     );
      }
      ppVar2 = stm->context->context;
      pVar9 = (*cubeb_pa_rtclock_now)();
      ppVar10 = (*p_Var3)(ppVar2,pVar9 + local_40 * 2,stream_drain_callback,stm);
      stm->drain_timer = ppVar10;
LAB_0010b909:
      stm->shutdown = 1;
      return;
    }
  }
  (*cubeb_pa_stream_cancel_write)(local_50);
  goto LAB_0010b909;
}

Assistant:

static void
trigger_user_callback(pa_stream * s, void const * input_data, size_t nbytes,
                      cubeb_stream * stm)
{
  void * buffer;
  size_t size;
  int r;
  long got;
  size_t towrite, read_offset;
  size_t frame_size;

  frame_size = WRAP(pa_frame_size)(&stm->output_sample_spec);
  assert(nbytes % frame_size == 0);

  towrite = nbytes;
  read_offset = 0;
  while (towrite) {
    size = towrite;
    r = WRAP(pa_stream_begin_write)(s, &buffer, &size);
    // Note: this has failed running under rr on occassion - needs
    // investigation.
    assert(r == 0);
    assert(size > 0);
    assert(size % frame_size == 0);

    LOGV("Trigger user callback with output buffer size=%zd, read_offset=%zd",
         size, read_offset);
    got = stm->data_callback(stm, stm->user_ptr,
                             (uint8_t const *)input_data + read_offset, buffer,
                             size / frame_size);
    if (got < 0) {
      WRAP(pa_stream_cancel_write)(s);
      stm->shutdown = 1;
      return;
    }
    // If more iterations move offset of read buffer
    if (input_data) {
      size_t in_frame_size = WRAP(pa_frame_size)(&stm->input_sample_spec);
      read_offset += (size / frame_size) * in_frame_size;
    }

    if (stm->volume != PULSE_NO_GAIN) {
      uint32_t samples = size * stm->output_sample_spec.channels / frame_size;

      if (stm->output_sample_spec.format == PA_SAMPLE_S16BE ||
          stm->output_sample_spec.format == PA_SAMPLE_S16LE) {
        short * b = buffer;
        for (uint32_t i = 0; i < samples; i++) {
          b[i] *= stm->volume;
        }
      } else {
        float * b = buffer;
        for (uint32_t i = 0; i < samples; i++) {
          b[i] *= stm->volume;
        }
      }
    }

    r = WRAP(pa_stream_write)(s, buffer, got * frame_size, NULL, 0,
                              PA_SEEK_RELATIVE);
    assert(r == 0);

    if ((size_t)got < size / frame_size) {
      pa_usec_t latency = 0;
      r = WRAP(pa_stream_get_latency)(s, &latency, NULL);
      if (r == -PA_ERR_NODATA) {
        /* this needs a better guess. */
        latency = 100 * PA_USEC_PER_MSEC;
      }
      assert(r == 0 || r == -PA_ERR_NODATA);
      /* pa_stream_drain is useless, see PA bug# 866. this is a workaround. */
      /* arbitrary safety margin: double the current latency. */
      assert(!stm->drain_timer);
      stm->drain_timer = WRAP(pa_context_rttime_new)(
          stm->context->context, WRAP(pa_rtclock_now)() + 2 * latency,
          stream_drain_callback, stm);
      stm->shutdown = 1;
      return;
    }

    towrite -= size;
  }

  assert(towrite == 0);
}